

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRunner.h
# Opt level: O3

int __thiscall
UnitTest::TestRunner::RunTestsIf<UnitTest::True>
          (TestRunner *this,TestList *list,char *suiteName,True *predicate,int maxTestTimeInMs)

{
  bool bVar1;
  int iVar2;
  Test *curTest;
  
  for (curTest = TestList::GetHead(list); curTest != (Test *)0x0; curTest = curTest->next) {
    bVar1 = IsTestInSuite(this,curTest,suiteName);
    if (bVar1) {
      RunTest(this,this->m_result,curTest,maxTestTimeInMs);
    }
  }
  iVar2 = Finish(this);
  return iVar2;
}

Assistant:

int RunTestsIf(TestList const& list, char const* suiteName, 
				   const Predicate& predicate, int maxTestTimeInMs) const
	{
	    Test* curTest = list.GetHead();

	    while (curTest != 0)
	    {
		    if (IsTestInSuite(curTest, suiteName) && predicate(curTest))
				RunTest(m_result, curTest, maxTestTimeInMs);

			curTest = curTest->next;
	    }

	    return Finish();
	}